

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O0

int buffer_to_file(buffer_t *buffer,char *fname,zip_error_t *error)

{
  int iVar1;
  FILE *__s;
  int *piVar2;
  zip_uint64_t local_40;
  zip_uint64_t nul_run;
  zip_uint64_t i;
  FILE *f;
  zip_error_t *error_local;
  char *fname_local;
  buffer_t *buffer_local;
  
  __s = fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    piVar2 = __errno_location();
    zip_error_set(error,0xb,*piVar2);
    buffer_local._4_4_ = -1;
  }
  else {
    fwrite("NiH0",4,1,__s);
    write_u64(buffer->fragment_size,(FILE *)__s);
    write_u64(buffer->size,(FILE *)__s);
    local_40 = 0;
    for (nul_run = 0; nul_run * buffer->fragment_size < buffer->size; nul_run = nul_run + 1) {
      if (buffer->fragment[nul_run] == (zip_uint8_t *)0x0) {
LAB_00103491:
        local_40 = local_40 + 1;
      }
      else {
        iVar1 = only_nul(buffer->fragment[nul_run],buffer->fragment_size);
        if (iVar1 != 0) goto LAB_00103491;
        if (local_40 != 0) {
          write_nuls(local_40,(FILE *)__s);
          local_40 = 0;
        }
        fwrite("NiH1",4,1,__s);
        fwrite(buffer->fragment[nul_run],1,buffer->fragment_size,__s);
      }
    }
    if (local_40 != 0) {
      write_nuls(local_40,(FILE *)__s);
    }
    iVar1 = fclose(__s);
    if (iVar1 == 0) {
      buffer_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      zip_error_set(error,6,*piVar2);
      buffer_local._4_4_ = -1;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

static int
buffer_to_file(buffer_t *buffer, const char *fname, zip_error_t *error) {
    FILE *f = fopen(fname, "wb");
    zip_uint64_t i;
    zip_uint64_t nul_run;

    if (f == NULL) {
	zip_error_set(error, ZIP_ER_OPEN, errno);
	return -1;
    }

    fwrite(MARK_BEGIN, 4, 1, f);
    write_u64(buffer->fragment_size, f);
    write_u64(buffer->size, f);

    nul_run = 0;
    for (i = 0; i * buffer->fragment_size < buffer->size; i++) {
	if (buffer->fragment[i] == NULL || only_nul(buffer->fragment[i], buffer->fragment_size)) {
	    nul_run++;
	}
	else {
	    if (nul_run > 0) {
		write_nuls(nul_run, f);
		nul_run = 0;
	    }
	    fwrite(MARK_DATA, 4, 1, f);

	    fwrite(buffer->fragment[i], 1, buffer->fragment_size, f);
	}
    }

    if (nul_run > 0) {
	write_nuls(nul_run, f);
    }

    if (fclose(f) != 0) {
	zip_error_set(error, ZIP_ER_WRITE, errno);
	return -1;
    }

    return 0;
}